

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

int mem_av_con_func_n(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  MIR_alias_t MVar1;
  MIR_alias_t MVar2;
  bitmap_t pVVar3;
  bitmap_el_t *pbVar4;
  ulong *puVar5;
  undefined8 *puVar6;
  long lVar7;
  ulong *puVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  bitmap_t pVVar13;
  bitmap_t pVVar14;
  ulong uVar15;
  const_bitmap_t pVVar16;
  const_bitmap_t pVVar17;
  const_bitmap_t pVVar18;
  const_bitmap_t src;
  const_bitmap_t mem2;
  MIR_op_t *dst;
  ulong uVar19;
  MIR_op_t *pMVar20;
  const_bitmap_t pVVar21;
  in_edge_t_conflict peVar22;
  ulong uVar23;
  const_bitmap_t pVStack_60;
  
  pVVar3 = gen_ctx->temp_bitmap;
  bitmap_copy(pVVar3,bb->in);
  peVar22 = (bb->in_edges).head;
  pVVar13 = bb->in;
  src = peVar22->src->out;
  bitmap_copy(pVVar13,src);
  while (peVar22 = (peVar22->in_link).next, peVar22 != (in_edge_t)0x0) {
    src = bb->in;
    pVVar13 = src;
    bitmap_and(src,src,peVar22->src->out);
  }
  pVVar14 = bb->in;
  if (pVVar14 == (bitmap_t)0x0) {
    mem_av_con_func_n_cold_2();
  }
  else if (pVVar3 != (bitmap_t)0x0) {
    uVar23 = pVVar14->els_num;
    uVar15 = pVVar3->els_num;
    pVVar13 = pVVar3;
    uVar19 = uVar15;
    if (uVar15 < uVar23) {
      pVVar13 = pVVar14;
      pVVar14 = pVVar3;
      uVar19 = uVar23;
      uVar23 = uVar15;
    }
    pbVar4 = pVVar13->varr;
    iVar10 = bcmp(pVVar14->varr,pbVar4,uVar23 * 8);
    iVar11 = 1;
    if (iVar10 == 0) {
      if (uVar23 < uVar19) {
        do {
          if (pbVar4[uVar23] != 0) {
            return 1;
          }
          uVar23 = uVar23 + 1;
        } while (uVar19 != uVar23);
      }
      iVar11 = 0;
    }
    return iVar11;
  }
  mem_av_con_func_n_cold_1();
  pVVar3 = (bitmap_t)pVVar13[3].size;
  bitmap_copy(pVVar3,(const_bitmap_t)src[4].varr);
  dst = (MIR_op_t *)src[4].varr;
  mem2 = (const_bitmap_t)src[5].els_num;
  bitmap_copy((bitmap_t)dst,mem2);
  if ((char)src[4].els_num == '\0') {
    puVar5 = (ulong *)src[4].size;
    if (puVar5 != (ulong *)0x0) {
      pVVar17 = (const_bitmap_t)0x0;
      pVVar16 = src;
      do {
        uVar15 = (ulong)pVVar17 >> 6;
        uVar23 = *puVar5;
        bVar9 = true;
        if (uVar15 < uVar23) {
          dst = (MIR_op_t *)puVar5[2];
          mem2 = (const_bitmap_t)(uVar23 << 6);
          pVVar18 = pVVar17;
LAB_00167715:
          if (((&dst->data)[uVar15] == (void *)0x0) ||
             (uVar19 = (ulong)(&dst->data)[uVar15] >> ((ulong)pVVar18 & 0x3f), uVar19 == 0))
          goto LAB_00167728;
          uVar23 = uVar19 & 1;
          pVStack_60 = pVVar18;
          while (uVar23 == 0) {
            pVStack_60 = (const_bitmap_t)((long)&pVStack_60->els_num + 1);
            uVar23 = uVar19 & 2;
            uVar19 = uVar19 >> 1;
          }
          bVar9 = false;
          pVVar17 = (const_bitmap_t)((long)&pVStack_60->els_num + 1);
        }
LAB_00167763:
        if (bVar9) goto LAB_00167654;
        puVar6 = *(undefined8 **)(pVVar13[0xe].els_num + 0x10);
        if (((puVar6 == (undefined8 *)0x0) || (puVar6[2] == 0)) ||
           ((const_bitmap_t)*puVar6 <= pVStack_60)) goto LAB_001678ce;
        lVar7 = **(long **)(puVar6[2] + (long)pVStack_60 * 8);
        pMVar20 = (MIR_op_t *)(lVar7 + 0x50);
        if (*(char *)(lVar7 + 0x28) == '\v') {
          pMVar20 = (MIR_op_t *)(lVar7 + 0x20);
        }
        puVar8 = (ulong *)src[5].els_num;
        if (puVar8 == (ulong *)0x0) goto LAB_001678c9;
        pVVar18 = (const_bitmap_t)0x0;
LAB_001677c6:
        uVar15 = (ulong)pVVar18 >> 6;
        uVar23 = *puVar8;
        bVar9 = true;
        pVVar21 = pVVar18;
        if (uVar15 < uVar23) {
          dst = (MIR_op_t *)puVar8[2];
          mem2 = (const_bitmap_t)(uVar23 << 6);
LAB_001677e3:
          if (((&dst->data)[uVar15] == (void *)0x0) ||
             (uVar19 = (ulong)(&dst->data)[uVar15] >> ((ulong)pVVar18 & 0x3f), uVar19 == 0))
          goto LAB_001677f6;
          uVar23 = uVar19 & 1;
          pVVar16 = pVVar18;
          while (uVar23 == 0) {
            pVVar16 = (const_bitmap_t)((long)&pVVar16->els_num + 1);
            uVar23 = uVar19 & 2;
            uVar19 = uVar19 >> 1;
          }
          bVar9 = false;
          pVVar21 = (const_bitmap_t)((long)&pVVar16->els_num + 1);
        }
LAB_0016782a:
        if (!bVar9) {
          puVar6 = *(undefined8 **)(pVVar13[0xe].els_num + 0x10);
          if (((puVar6 == (undefined8 *)0x0) || (puVar6[2] == 0)) ||
             ((const_bitmap_t)*puVar6 <= pVVar16)) goto LAB_001678c4;
          mem2 = (const_bitmap_t)**(size_t **)(puVar6[2] + (long)pVVar16 * 8);
          if (*(char *)&mem2[1].varr == '\v') {
            mem2 = (const_bitmap_t)&mem2[1].size;
            dst = pMVar20;
            iVar10 = may_mem_alias_p(pMVar20,(MIR_op_t *)mem2);
            if (iVar10 != 0) goto LAB_001678b1;
          }
          pVVar18 = pVVar21;
          if (puVar8 == (ulong *)0x0) goto LAB_001678c9;
          goto LAB_001677c6;
        }
        pMVar20 = (MIR_op_t *)src[4].varr;
        mem2 = (const_bitmap_t)((long)&pVStack_60->els_num + 1);
        dst = pMVar20;
        bitmap_expand((bitmap_t)pMVar20,(size_t)mem2);
        if (pMVar20 == (MIR_op_t *)0x0) goto LAB_001678d3;
        puVar8 = (bitmap_el_t *)(pMVar20->u).str.len + ((ulong)pVStack_60 >> 6);
        *puVar8 = *puVar8 | 1L << ((ulong)pVStack_60 & 0x3f);
LAB_001678b1:
        if (puVar5 == (ulong *)0x0) break;
      } while( true );
    }
    mem_av_trans_func_cold_7();
LAB_001678c4:
    mem_av_trans_func_cold_1();
LAB_001678c9:
    mem_av_trans_func_cold_3();
LAB_001678ce:
    mem_av_trans_func_cold_4();
LAB_001678d3:
    mem_av_trans_func_cold_2();
  }
  else {
LAB_00167654:
    pVVar13 = (bitmap_t)src[4].varr;
    if (pVVar13 != (bitmap_t)0x0) {
      mem2 = pVVar3;
      if (pVVar3 != (bitmap_t)0x0) {
        uVar23 = pVVar13->els_num;
        uVar15 = pVVar3->els_num;
        pVVar14 = pVVar3;
        uVar19 = uVar15;
        if (uVar15 < uVar23) {
          pVVar14 = pVVar13;
          pVVar13 = pVVar3;
          uVar19 = uVar23;
          uVar23 = uVar15;
        }
        pbVar4 = pVVar14->varr;
        iVar10 = bcmp(pVVar13->varr,pbVar4,uVar23 * 8);
        iVar11 = 1;
        if (iVar10 == 0) {
          if (uVar23 < uVar19) {
            do {
              if (pbVar4[uVar23] != 0) {
                return 1;
              }
              uVar23 = uVar23 + 1;
            } while (uVar19 != uVar23);
          }
          iVar11 = 0;
        }
        return iVar11;
      }
      goto LAB_001678dd;
    }
  }
  mem_av_trans_func_cold_6();
LAB_001678dd:
  mem_av_trans_func_cold_5();
  if (((char)*(size_t *)&dst->field_0x8 != '\v') || ((char)mem2->size != '\v')) {
    __assert_fail("mem1->mode == MIR_OP_VAR_MEM && mem2->mode == MIR_OP_VAR_MEM",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0xd72,"int may_mem_alias_p(const MIR_op_t *, const MIR_op_t *)");
  }
  MVar1 = (dst->u).mem.alias;
  iVar10 = *(int *)((long)&dst->u + 8);
  MVar2 = *(MIR_alias_t *)((long)&mem2->varr + 4);
  iVar11 = (int)mem2[1].els_num;
  if ((((MVar1 == MVar2) || (MVar1 == 0)) || (iVar12 = 0, MVar2 == 0)) &&
     (iVar12 = 1, iVar11 != 0 && iVar10 != 0)) {
    return (int)(iVar10 != iVar11);
  }
  return iVar12;
LAB_00167728:
  uVar15 = uVar15 + 1;
  pVVar18 = (const_bitmap_t)(uVar15 * 0x40);
  pVVar17 = mem2;
  if (uVar23 == uVar15) goto LAB_00167763;
  goto LAB_00167715;
LAB_001677f6:
  uVar15 = uVar15 + 1;
  pVVar18 = (const_bitmap_t)(uVar15 * 0x40);
  pVVar21 = mem2;
  if (uVar23 == uVar15) goto LAB_0016782a;
  goto LAB_001677e3;
}

Assistant:

static int mem_av_con_func_n (gen_ctx_t gen_ctx, bb_t bb) {
  edge_t e, head;
  bitmap_t prev_mem_av_in = temp_bitmap;

  bitmap_copy (prev_mem_av_in, bb->mem_av_in);
  head = DLIST_HEAD (in_edge_t, bb->in_edges);
  bitmap_copy (bb->mem_av_in, head->src->mem_av_out);
  for (e = DLIST_NEXT (in_edge_t, head); e != NULL; e = DLIST_NEXT (in_edge_t, e))
    bitmap_and (bb->mem_av_in, bb->mem_av_in, e->src->mem_av_out); /* mem_av_in &= mem_av_out */
  return !bitmap_equal_p (bb->mem_av_in, prev_mem_av_in);
}